

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bnll_x86.cpp
# Opt level: O0

int __thiscall ncnn::BNLL_x86::forward_inplace(BNLL_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long *in_RSI;
  float fVar8;
  ulong uVar9;
  float fVar13;
  ulong uVar10;
  float fVar14;
  ulong uVar15;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar17;
  ulong uVar16;
  int iVar18;
  __m128 _x;
  __m128 _tmp;
  __m128 _abs_p;
  __m128 mask;
  __m128 _p;
  __m128 _zero;
  __m128 _one;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  v4sf y_1;
  v4sf z;
  v4sf tmp_1;
  v4sf mask_2;
  v4sf e;
  v4sf invalid_mask;
  v4sf one_1;
  v4si emm0_1;
  v4sf pow2n;
  v4sf y;
  v4sf mask_1;
  v4sf one;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  float local_f68;
  float fStack_f64;
  float fStack_f60;
  float fStack_f5c;
  undefined8 local_f28;
  undefined8 uStack_f20;
  int local_ef8;
  undefined8 local_ee8;
  undefined8 local_ee0;
  undefined8 local_ed8;
  undefined4 local_ed0;
  long local_ec8;
  undefined4 local_ec0;
  undefined4 local_ebc;
  undefined4 local_eb8;
  undefined4 local_eb4;
  undefined4 local_eb0;
  undefined8 local_ea8;
  float *local_ea0;
  int local_e94;
  int local_e90;
  int local_e8c;
  int local_e88;
  int local_e84;
  int local_e80;
  int local_e7c;
  long *local_e70;
  undefined1 local_e5d;
  int local_e5c;
  undefined8 *local_e50;
  undefined8 *local_e48;
  undefined8 *local_e38;
  undefined4 local_e28;
  undefined4 uStack_e24;
  undefined4 uStack_e20;
  undefined4 uStack_e1c;
  undefined4 local_e0c;
  undefined8 local_e08;
  undefined8 uStack_e00;
  float *local_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  ulong local_dc8;
  ulong uStack_dc0;
  ulong local_db8;
  ulong uStack_db0;
  int local_da8 [2];
  int aiStack_da0 [2];
  ulong local_d98;
  ulong uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  float local_d78;
  float fStack_d74;
  float fStack_d70;
  float fStack_d6c;
  ulong local_d68;
  ulong uStack_d60;
  int local_d58;
  int iStack_d54;
  int iStack_d50;
  int iStack_d4c;
  float local_d48;
  float fStack_d44;
  float fStack_d40;
  float fStack_d3c;
  int local_d38;
  int iStack_d34;
  int iStack_d30;
  int iStack_d2c;
  undefined8 local_d28;
  undefined8 uStack_d20;
  int local_d18;
  int iStack_d14;
  int iStack_d10;
  int iStack_d0c;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  ulong local_ce8;
  ulong uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  ulong local_cc8;
  ulong uStack_cc0;
  ulong local_cb8;
  ulong uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  ulong local_c98;
  ulong uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  float local_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  float local_ba8;
  float fStack_ba4;
  float fStack_ba0;
  float fStack_b9c;
  float local_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  ulong local_b28;
  ulong uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  ulong local_a88;
  ulong uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  float *local_a40;
  long local_a38;
  undefined4 local_a2c;
  long local_a28;
  float *local_a20;
  undefined4 local_a14;
  int local_a10;
  int local_a0c;
  undefined8 *local_a08;
  undefined4 local_9fc;
  long local_9f8;
  undefined8 *local_9d8;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined4 local_93c;
  undefined8 local_938;
  undefined8 uStack_930;
  ulong local_928;
  ulong uStack_920;
  ulong local_918;
  ulong uStack_910;
  ulong local_908;
  ulong uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  ulong local_8e8;
  ulong uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 *local_7b0;
  undefined8 *local_7a8;
  undefined8 *local_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  float local_788;
  float fStack_784;
  float fStack_780;
  float fStack_77c;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  float *local_750;
  undefined8 *local_748;
  undefined8 *local_740;
  float local_738 [2];
  float afStack_730 [2];
  float local_728;
  float fStack_724;
  float fStack_720;
  float fStack_71c;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  float *local_6f0;
  undefined8 *local_6e8;
  undefined8 *local_6e0;
  float local_6d8 [2];
  float afStack_6d0 [2];
  float local_6c8;
  float fStack_6c4;
  float fStack_6c0;
  float fStack_6bc;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  float *local_690;
  undefined8 *local_688;
  undefined8 *local_680;
  float local_678 [2];
  float afStack_670 [2];
  float local_668;
  float fStack_664;
  float fStack_660;
  float fStack_65c;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  float *local_630;
  undefined8 *local_628;
  undefined8 *local_620;
  float local_618 [2];
  float afStack_610 [2];
  float local_608;
  float fStack_604;
  float fStack_600;
  float fStack_5fc;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  float *local_5d0;
  undefined8 *local_5c8;
  undefined8 *local_5c0;
  float local_5b8 [2];
  float afStack_5b0 [2];
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 *local_570;
  float *local_568;
  float *local_560;
  undefined8 local_558;
  undefined8 uStack_550;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_538 [2];
  float afStack_530 [2];
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 *local_510;
  float *local_508;
  float *local_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4d8 [2];
  float afStack_4d0 [2];
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  float *local_4b0;
  undefined8 *local_4a8;
  undefined8 *local_4a0;
  float local_498 [2];
  float afStack_490 [2];
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  float *local_450;
  undefined8 *local_448;
  undefined8 *local_440;
  float local_438 [2];
  float afStack_430 [2];
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  float *local_3f0;
  undefined8 *local_3e8;
  undefined8 *local_3e0;
  float local_3d8 [2];
  float afStack_3d0 [2];
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  float *local_390;
  undefined8 *local_388;
  undefined8 *local_380;
  float local_378 [2];
  float afStack_370 [2];
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  float *local_330;
  undefined8 *local_328;
  undefined8 *local_320;
  float local_318 [2];
  float afStack_310 [2];
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  float *local_2d0;
  undefined8 *local_2c8;
  undefined8 *local_2c0;
  float local_2b8 [2];
  float afStack_2b0 [2];
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  float *local_270;
  undefined8 *local_268;
  undefined8 *local_260;
  float local_258 [2];
  float afStack_250 [2];
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  float *local_210;
  undefined8 *local_208;
  undefined8 *local_200;
  float local_1f8 [2];
  float afStack_1f0 [2];
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 *local_1b0;
  float *local_1a8;
  float *local_1a0;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  float local_178 [2];
  float afStack_170 [2];
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 *local_150;
  float *local_148;
  float *local_140;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118 [2];
  float afStack_110 [2];
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 *local_f0;
  float *local_e8;
  float *local_e0;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  float local_b8 [2];
  float afStack_b0 [2];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_e7c = *(int *)((long)in_RSI + 0x2c);
  local_e80 = (int)in_RSI[6];
  local_e84 = *(int *)((long)in_RSI + 0x34);
  local_e88 = (int)in_RSI[7];
  local_e8c = (int)in_RSI[3];
  local_e90 = local_e7c * local_e80 * local_e84 * local_e8c;
  local_e70 = in_RSI;
  for (local_e94 = 0; local_e94 < local_e88; local_e94 = local_e94 + 1) {
    local_e50 = &local_ee8;
    local_a0c = *(int *)((long)local_e70 + 0x2c);
    local_a10 = (int)local_e70[6];
    local_a14 = *(undefined4 *)((long)local_e70 + 0x34);
    local_a20 = (float *)(*local_e70 + local_e70[8] * (long)local_e94 * local_e70[2]);
    local_a28 = local_e70[2];
    local_a2c = (undefined4)local_e70[3];
    local_a38 = local_e70[4];
    local_a08 = &local_ee8;
    local_9f8 = (long)local_a0c * (long)local_a10 * local_a28;
    local_e48 = &local_ee8;
    local_e38 = &local_ee8;
    local_9fc = 0x10;
    local_e5c = local_e94;
    local_e5d = 1;
    local_ee8 = 0;
    local_ed8 = 0;
    local_ed0 = 0;
    local_ec0 = 0;
    local_ebc = 0;
    local_eb8 = 0;
    local_eb4 = 0;
    local_eb0 = 0;
    local_ea8 = 0;
    local_ee0 = 0;
    local_e0c = 0x3f800000;
    local_e28 = 0x3f800000;
    uStack_e24 = 0x3f800000;
    uStack_e20 = 0x3f800000;
    uStack_e1c = 0x3f800000;
    local_e08 = 0;
    uStack_e00 = 0;
    local_ea0 = local_a20;
    for (local_ef8 = 0; local_9d8 = local_e38, local_ec8 = local_a38, local_ef8 + 3 < local_e90;
        local_ef8 = local_ef8 + 4) {
      local_df0 = local_ea0;
      local_db8 = *(ulong *)local_ea0;
      uStack_db0 = *(ulong *)(local_ea0 + 2);
      local_de8 = 0;
      uStack_de0 = 0;
      local_dd8._0_4_ = (float)local_db8;
      local_dd8._4_4_ = (float)(local_db8 >> 0x20);
      uStack_dd0._0_4_ = (float)uStack_db0;
      uStack_dd0._4_4_ = (float)(uStack_db0 >> 0x20);
      local_da8[0] = 0x7fffffff;
      local_da8[1] = 0x7fffffff;
      aiStack_da0[0] = 0x7fffffff;
      aiStack_da0[1] = 0x7fffffff;
      uVar9 = local_db8 & 0x7fffffff7fffffff;
      uVar15 = uStack_db0 & 0x7fffffff7fffffff;
      local_a68 = 0;
      uStack_a60 = 0;
      local_a78._0_4_ = (float)uVar9;
      local_a78._4_4_ = (float)(uVar9 >> 0x20);
      uStack_a70._0_4_ = (float)uVar15;
      uStack_a70._4_4_ = (float)(uVar15 >> 0x20);
      local_b78 = CONCAT44(0.0 - local_a78._4_4_,0.0 - (float)local_a78);
      uStack_b70._0_4_ = 0.0 - (float)uStack_a70;
      uStack_b70._4_4_ = 0.0 - uStack_a70._4_4_;
      local_b68 = 0;
      uStack_b60 = 0;
      local_d28 = 0x3f8000003f800000;
      uStack_d20 = 0x3f8000003f800000;
      local_88 = local_b78;
      uStack_80 = uStack_b70;
      local_98 = 0x42b0c0a542b0c0a5;
      uStack_90 = 0x42b0c0a542b0c0a5;
      auVar7._8_8_ = uStack_b70;
      auVar7._0_8_ = local_b78;
      auVar6._8_8_ = 0x42b0c0a542b0c0a5;
      auVar6._0_8_ = 0x42b0c0a542b0c0a5;
      auVar11 = minps(auVar7,auVar6);
      local_b78 = auVar11._0_8_;
      local_978 = local_b78;
      uStack_b70 = auVar11._8_8_;
      uStack_970 = uStack_b70;
      local_988 = 0xc2b0c0a5c2b0c0a5;
      uStack_980 = 0xc2b0c0a5c2b0c0a5;
      auVar12._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar12._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar12 = maxps(auVar11,auVar12);
      local_b78 = auVar12._0_8_;
      uVar1 = local_b78;
      uStack_b70 = auVar12._8_8_;
      uVar2 = uStack_b70;
      local_838 = 0x3fb8aa3b3fb8aa3b;
      uStack_830 = 0x3fb8aa3b3fb8aa3b;
      local_828._0_4_ = auVar12._0_4_;
      local_828._4_4_ = auVar12._4_4_;
      uStack_820._0_4_ = auVar12._8_4_;
      uStack_820._4_4_ = auVar12._12_4_;
      local_ae8 = CONCAT44(local_828._4_4_ * 1.442695,(float)local_828 * 1.442695);
      uStack_ae0 = CONCAT44(uStack_820._4_4_ * 1.442695,(float)uStack_820 * 1.442695);
      local_af8 = 0x3f0000003f000000;
      uStack_af0 = 0x3f0000003f000000;
      fVar8 = (float)local_828 * 1.442695 + 0.5;
      fVar13 = local_828._4_4_ * 1.442695 + 0.5;
      fVar14 = (float)uStack_820 * 1.442695 + 0.5;
      fVar17 = uStack_820._4_4_ * 1.442695 + 0.5;
      local_68 = CONCAT44(fVar13,fVar8);
      uStack_60 = CONCAT44(fVar17,fVar14);
      local_8b8 = CONCAT44((int)fVar13,(int)fVar8);
      uStack_8b0 = CONCAT44((int)fVar17,(int)fVar14);
      local_b98 = (float)(int)fVar8;
      fStack_b94 = (float)(int)fVar13;
      fStack_b90 = (float)(int)fVar14;
      fStack_b8c = (float)(int)fVar17;
      local_b88 = CONCAT44(fStack_b94,local_b98);
      uStack_b80 = CONCAT44(fStack_b8c,fStack_b90);
      local_b48 = local_b88;
      uStack_b40 = uStack_b80;
      local_b58 = CONCAT44(fVar13,fVar8);
      uStack_b50 = CONCAT44(fVar17,fVar14);
      local_bc8 = CONCAT44(-(uint)(fVar13 < fStack_b94),-(uint)(fVar8 < local_b98));
      uStack_bc0 = CONCAT44(-(uint)(fVar17 < fStack_b8c),-(uint)(fVar14 < fStack_b90));
      local_b28 = local_bc8;
      uStack_b20 = uStack_bc0;
      local_b38 = 0x3f8000003f800000;
      uStack_b30 = 0x3f8000003f800000;
      local_bc8 = local_bc8 & 0x3f8000003f800000;
      uStack_bc0 = uStack_bc0 & 0x3f8000003f800000;
      local_ac8 = local_b88;
      uStack_ac0 = uStack_b80;
      local_ad8._0_4_ = (float)local_bc8;
      local_ad8._4_4_ = (float)(local_bc8 >> 0x20);
      uStack_ad0._0_4_ = (float)uStack_bc0;
      uStack_ad0._4_4_ = (float)(uStack_bc0 >> 0x20);
      local_b98 = local_b98 - (float)local_ad8;
      fStack_b94 = fStack_b94 - local_ad8._4_4_;
      fStack_b90 = fStack_b90 - (float)uStack_ad0;
      fStack_b8c = fStack_b8c - uStack_ad0._4_4_;
      local_1a0 = &local_b98;
      local_148 = ::_ps_cephes_exp_C1;
      local_7b0 = &local_b78;
      local_128 = local_b78;
      uStack_120 = uStack_b70;
      local_108 = CONCAT44(fStack_b94,local_b98);
      uStack_100 = CONCAT44(fStack_b8c,fStack_b90);
      local_118[0] = 0.6933594;
      local_118[1] = 0.6933594;
      afStack_110[0] = 0.6933594;
      afStack_110[1] = 0.6933594;
      local_138 = local_b98 * 0.6933594;
      fStack_134 = fStack_b94 * 0.6933594;
      fStack_130 = fStack_b90 * 0.6933594;
      fStack_12c = fStack_b8c * 0.6933594;
      local_b78 = CONCAT44(local_828._4_4_ - fStack_134,(float)local_828 - local_138);
      uStack_b70._0_4_ = (float)uStack_820 - fStack_130;
      uStack_b70._4_4_ = uStack_820._4_4_ - fStack_12c;
      local_1a8 = ::_ps_cephes_exp_C2;
      local_188 = local_b78;
      uStack_180 = uStack_b70;
      local_168 = CONCAT44(fStack_b94,local_b98);
      uStack_160 = CONCAT44(fStack_b8c,fStack_b90);
      local_178[0] = -0.00021219444;
      local_178[1] = -0.00021219444;
      afStack_170[0] = -0.00021219444;
      afStack_170[1] = -0.00021219444;
      local_198 = local_b98 * -0.00021219444;
      fStack_194 = fStack_b94 * -0.00021219444;
      fStack_190 = fStack_b90 * -0.00021219444;
      fStack_18c = fStack_b8c * -0.00021219444;
      fVar8 = ((float)local_828 - local_138) - local_198;
      fVar13 = (local_828._4_4_ - fStack_134) - fStack_194;
      fVar14 = ((float)uStack_820 - fStack_130) - fStack_190;
      fVar17 = (uStack_820._4_4_ - fStack_12c) - fStack_18c;
      local_b78 = CONCAT44(fVar13,fVar8);
      uStack_b70._0_4_ = fVar14;
      uStack_b70._4_4_ = fVar17;
      local_858 = local_b78;
      uStack_850 = uStack_b70;
      local_b88 = CONCAT44(fVar13 * fVar13,fVar8 * fVar8);
      uStack_b80 = CONCAT44(fVar17 * fVar17,fVar14 * fVar14);
      local_7a0 = &local_bd8;
      local_5d0 = ::_ps_cephes_exp_p1;
      local_588 = 0x3950696739506967;
      uStack_580 = 0x3950696739506967;
      local_598 = local_b78;
      uStack_590 = uStack_b70;
      local_5a8 = fVar8 * 0.00019875691;
      fStack_5a4 = fVar13 * 0.00019875691;
      fStack_5a0 = fVar14 * 0.00019875691;
      fStack_59c = fVar17 * 0.00019875691;
      local_5b8[0] = 0.0013981999;
      local_5b8[1] = 0.0013981999;
      afStack_5b0[0] = 0.0013981999;
      afStack_5b0[1] = 0.0013981999;
      local_bd8 = CONCAT44(fStack_5a4 + 0.0013981999,local_5a8 + 0.0013981999);
      uStack_bd0 = CONCAT44(fStack_59c + 0.0013981999,fStack_5a0 + 0.0013981999);
      local_630 = ::_ps_cephes_exp_p2;
      local_5e8 = local_bd8;
      uStack_5e0 = uStack_bd0;
      local_5f8 = local_b78;
      uStack_5f0 = uStack_b70;
      local_608 = (local_5a8 + 0.0013981999) * fVar8;
      fStack_604 = (fStack_5a4 + 0.0013981999) * fVar13;
      fStack_600 = (fStack_5a0 + 0.0013981999) * fVar14;
      fStack_5fc = (fStack_59c + 0.0013981999) * fVar17;
      local_618[0] = 0.008333452;
      local_618[1] = 0.008333452;
      afStack_610[0] = 0.008333452;
      afStack_610[1] = 0.008333452;
      local_bd8 = CONCAT44(fStack_604 + 0.008333452,local_608 + 0.008333452);
      uStack_bd0 = CONCAT44(fStack_5fc + 0.008333452,fStack_600 + 0.008333452);
      local_690 = ::_ps_cephes_exp_p3;
      local_648 = local_bd8;
      uStack_640 = uStack_bd0;
      local_658 = local_b78;
      uStack_650 = uStack_b70;
      local_668 = (local_608 + 0.008333452) * fVar8;
      fStack_664 = (fStack_604 + 0.008333452) * fVar13;
      fStack_660 = (fStack_600 + 0.008333452) * fVar14;
      fStack_65c = (fStack_5fc + 0.008333452) * fVar17;
      local_678[0] = 0.041665796;
      local_678[1] = 0.041665796;
      afStack_670[0] = 0.041665796;
      afStack_670[1] = 0.041665796;
      local_bd8 = CONCAT44(fStack_664 + 0.041665796,local_668 + 0.041665796);
      uStack_bd0 = CONCAT44(fStack_65c + 0.041665796,fStack_660 + 0.041665796);
      local_6f0 = ::_ps_cephes_exp_p4;
      local_6a8 = local_bd8;
      uStack_6a0 = uStack_bd0;
      local_6b8 = local_b78;
      uStack_6b0 = uStack_b70;
      local_6c8 = (local_668 + 0.041665796) * fVar8;
      fStack_6c4 = (fStack_664 + 0.041665796) * fVar13;
      fStack_6c0 = (fStack_660 + 0.041665796) * fVar14;
      fStack_6bc = (fStack_65c + 0.041665796) * fVar17;
      local_6d8[0] = 0.16666666;
      local_6d8[1] = 0.16666666;
      afStack_6d0[0] = 0.16666666;
      afStack_6d0[1] = 0.16666666;
      local_bd8 = CONCAT44(fStack_6c4 + 0.16666666,local_6c8 + 0.16666666);
      uStack_bd0 = CONCAT44(fStack_6bc + 0.16666666,fStack_6c0 + 0.16666666);
      local_750 = ::_ps_cephes_exp_p5;
      local_708 = local_bd8;
      uStack_700 = uStack_bd0;
      local_718 = local_b78;
      uStack_710 = uStack_b70;
      local_728 = (local_6c8 + 0.16666666) * fVar8;
      fStack_724 = (fStack_6c4 + 0.16666666) * fVar13;
      fStack_720 = (fStack_6c0 + 0.16666666) * fVar14;
      fStack_71c = (fStack_6bc + 0.16666666) * fVar17;
      local_738[0] = 0.5;
      local_738[1] = 0.5;
      afStack_730[0] = 0.5;
      afStack_730[1] = 0.5;
      local_bd8 = CONCAT44(fStack_724 + 0.5,local_728 + 0.5);
      uStack_bd0 = CONCAT44(fStack_71c + 0.5,fStack_720 + 0.5);
      local_7a8 = &local_b88;
      local_768 = local_bd8;
      uStack_760 = uStack_bd0;
      local_778 = local_b88;
      uStack_770 = uStack_b80;
      local_788 = (local_728 + 0.5) * fVar8 * fVar8;
      fStack_784 = (fStack_724 + 0.5) * fVar13 * fVar13;
      fStack_780 = (fStack_720 + 0.5) * fVar14 * fVar14;
      fStack_77c = (fStack_71c + 0.5) * fVar17 * fVar17;
      local_798 = local_b78;
      uStack_790 = uStack_b70;
      local_bd8 = CONCAT44(fStack_784 + fVar13,local_788 + fVar8);
      uStack_bd0 = CONCAT44(fStack_77c + fVar17,fStack_780 + fVar14);
      local_b08 = local_bd8;
      uStack_b00 = uStack_bd0;
      local_b18 = 0x3f8000003f800000;
      uStack_b10 = 0x3f8000003f800000;
      fVar8 = local_788 + fVar8 + 1.0;
      fVar13 = fStack_784 + fVar13 + 1.0;
      fVar14 = fStack_780 + fVar14 + 1.0;
      fVar17 = fStack_77c + fVar17 + 1.0;
      local_bd8 = CONCAT44(fVar13,fVar8);
      uStack_bd0 = CONCAT44(fVar17,fVar14);
      local_78 = CONCAT44(fStack_b94,local_b98);
      uStack_70 = CONCAT44(fStack_b8c,fStack_b90);
      local_48 = CONCAT44((int)fStack_b94,(int)local_b98);
      uStack_40 = CONCAT44((int)fStack_b8c,(int)fStack_b90);
      local_8d8 = 0x7f0000007f;
      uStack_8d0 = 0x7f0000007f;
      iVar18 = (int)local_b98 + 0x7f;
      fStack_ba4 = (float)((int)fStack_b94 + 0x7f);
      fStack_ba0 = (float)((int)fStack_b90 + 0x7f);
      fStack_b9c = (float)((int)fStack_b8c + 0x7f);
      local_28 = CONCAT44(fStack_ba4,iVar18);
      uStack_20 = CONCAT44(fStack_b9c,fStack_ba0);
      local_2c = 0x17;
      local_ba8 = (float)(iVar18 * 0x800000);
      local_be8 = CONCAT44(fStack_ba4,local_ba8);
      uStack_be0 = CONCAT44(fStack_b9c,fStack_ba0);
      local_868 = local_bd8;
      uStack_860 = uStack_bd0;
      fVar8 = fVar8 * local_ba8;
      fVar13 = fVar13 * fStack_ba4;
      fVar14 = fVar14 * fStack_ba0;
      fVar17 = fVar17 * fStack_b9c;
      local_bd8 = CONCAT44(fVar13,fVar8);
      uStack_bd0 = CONCAT44(fVar17,fVar14);
      local_c08 = local_bd8;
      uStack_c00 = uStack_bd0;
      fVar8 = fVar8 + 1.0;
      fVar13 = fVar13 + 1.0;
      fVar14 = fVar14 + 1.0;
      fVar17 = fVar17 + 1.0;
      local_d08 = CONCAT44(fVar13,fVar8);
      uStack_d00._0_4_ = fVar14;
      uStack_d00._4_4_ = fVar17;
      local_998 = local_d08;
      uStack_990 = uStack_d00;
      local_cf8 = 0;
      uStack_cf0 = 0;
      local_9a8 = 0;
      uStack_9a0 = 0;
      local_d38 = -(uint)(fVar8 <= 0.0);
      iStack_d34 = -(uint)(fVar13 <= 0.0);
      iStack_d30 = -(uint)(fVar14 <= 0.0);
      iStack_d2c = -(uint)(fVar17 <= 0.0);
      local_958 = local_d08;
      uStack_950 = uStack_d00;
      local_968 = 0x80000000800000;
      uStack_960 = 0x80000000800000;
      auVar5._8_8_ = uStack_d00;
      auVar5._0_8_ = local_d08;
      auVar11._8_8_ = 0x80000000800000;
      auVar11._0_8_ = 0x80000000800000;
      auVar12 = maxps(auVar5,auVar11);
      local_d08 = auVar12._0_8_;
      local_928 = local_d08;
      uStack_d00 = auVar12._8_8_;
      uStack_920 = uStack_d00;
      uVar3 = local_d08;
      uVar4 = uStack_d00;
      local_93c = 0x17;
      local_938._0_4_ = auVar12._0_4_;
      local_938._4_4_ = auVar12._4_4_;
      uStack_930._0_4_ = auVar12._8_4_;
      uStack_930._4_4_ = auVar12._12_4_;
      local_c98 = local_d08;
      uStack_c90 = uStack_d00;
      local_ca8 = 0x807fffff807fffff;
      uStack_ca0 = 0x807fffff807fffff;
      local_8e8 = local_d08 & 0x807fffff807fffff;
      uStack_8e0 = uStack_d00 & 0x807fffff807fffff;
      local_cb8 = local_8e8 | 0x3f0000003f000000;
      uStack_cb0 = uStack_8e0 | 0x3f0000003f000000;
      local_8c8 = CONCAT44(local_938._4_4_ >> 0x17,(uint)local_938 >> 0x17);
      uStack_8c0 = CONCAT44(uStack_930._4_4_ >> 0x17,(uint)uStack_930 >> 0x17);
      local_d18 = ((uint)local_938 >> 0x17) - 0x7f;
      iStack_d14 = (local_938._4_4_ >> 0x17) - 0x7f;
      iStack_d10 = ((uint)uStack_930 >> 0x17) - 0x7f;
      iStack_d0c = (uStack_930._4_4_ >> 0x17) - 0x7f;
      local_8a8 = CONCAT44(iStack_d14,local_d18);
      uStack_8a0 = CONCAT44(iStack_d0c,iStack_d10);
      local_c38 = CONCAT44((float)iStack_d14,(float)local_d18);
      uStack_c30 = CONCAT44((float)iStack_d0c,(float)iStack_d10);
      local_c48 = 0x3f8000003f800000;
      uStack_c40 = 0x3f8000003f800000;
      local_d48 = (float)local_d18 + 1.0;
      fStack_d44 = (float)iStack_d14 + 1.0;
      fStack_d40 = (float)iStack_d10 + 1.0;
      fStack_d3c = (float)iStack_d0c + 1.0;
      local_898 = 0x3f3504f33f3504f3;
      uStack_890 = 0x3f3504f33f3504f3;
      local_888._0_4_ = (float)local_cb8;
      local_888._4_4_ = (float)(local_cb8 >> 0x20);
      uStack_880._0_4_ = (float)uStack_cb0;
      uStack_880._4_4_ = (float)(uStack_cb0 >> 0x20);
      local_d58 = -(uint)((float)local_888 < 0.70710677);
      iStack_d54 = -(uint)(local_888._4_4_ < 0.70710677);
      iStack_d50 = -(uint)((float)uStack_880 < 0.70710677);
      iStack_d4c = -(uint)(uStack_880._4_4_ < 0.70710677);
      local_cc8 = CONCAT44(iStack_d54,local_d58);
      uStack_cc0 = CONCAT44(iStack_d4c,iStack_d50);
      local_d68 = local_cb8 & local_cc8;
      uStack_d60 = uStack_cb0 & uStack_cc0;
      local_a98 = 0x3f8000003f800000;
      uStack_a90 = 0x3f8000003f800000;
      local_d08 = CONCAT44(local_888._4_4_ - 1.0,(float)local_888 - 1.0);
      uStack_d00._0_4_ = (float)uStack_880 - 1.0;
      uStack_d00._4_4_ = uStack_880._4_4_ - 1.0;
      local_aa8 = CONCAT44(fStack_d44,local_d48);
      uStack_aa0 = CONCAT44(fStack_d3c,fStack_d40);
      local_cd8 = 0x3f8000003f800000;
      uStack_cd0 = 0x3f8000003f800000;
      local_ce8 = CONCAT44(iStack_d54,local_d58);
      uStack_ce0 = CONCAT44(iStack_d4c,iStack_d50);
      uVar10 = local_ce8 & 0x3f8000003f800000;
      uVar16 = uStack_ce0 & 0x3f8000003f800000;
      local_ab8._0_4_ = (float)uVar10;
      local_ab8._4_4_ = (float)(uVar10 >> 0x20);
      uStack_ab0._0_4_ = (float)uVar16;
      uStack_ab0._4_4_ = (float)(uVar16 >> 0x20);
      local_d48 = local_d48 - (float)local_ab8;
      fStack_d44 = fStack_d44 - local_ab8._4_4_;
      fStack_d40 = fStack_d40 - (float)uStack_ab0;
      fStack_d3c = fStack_d3c - uStack_ab0._4_4_;
      local_c58 = local_d08;
      uStack_c50 = uStack_d00;
      local_c68._0_4_ = (float)local_d68;
      local_c68._4_4_ = (float)(local_d68 >> 0x20);
      uStack_c60._0_4_ = (float)uStack_d60;
      uStack_c60._4_4_ = (float)(uStack_d60 >> 0x20);
      local_c68._0_4_ = ((float)local_888 - 1.0) + (float)local_c68;
      local_c68._4_4_ = (local_888._4_4_ - 1.0) + local_c68._4_4_;
      uStack_c60._0_4_ = ((float)uStack_880 - 1.0) + (float)uStack_c60;
      uStack_c60._4_4_ = (uStack_880._4_4_ - 1.0) + uStack_c60._4_4_;
      local_d08 = CONCAT44(local_c68._4_4_,(float)local_c68);
      uStack_d00._0_4_ = (float)uStack_c60;
      uStack_d00._4_4_ = uStack_c60._4_4_;
      local_7d8 = local_d08;
      uStack_7d0 = uStack_d00;
      local_d78 = (float)local_c68 * (float)local_c68;
      fStack_d74 = local_c68._4_4_ * local_c68._4_4_;
      fStack_d70 = (float)uStack_c60 * (float)uStack_c60;
      fStack_d6c = uStack_c60._4_4_ * uStack_c60._4_4_;
      local_200 = &local_d88;
      local_208 = &local_d08;
      local_210 = ::_ps_cephes_log_p1;
      local_1c8 = 0x3d9021bb3d9021bb;
      uStack_1c0 = 0x3d9021bb3d9021bb;
      local_1d8 = local_d08;
      uStack_1d0 = uStack_d00;
      local_1e8 = (float)local_c68 * 0.070376836;
      fStack_1e4 = local_c68._4_4_ * 0.070376836;
      fStack_1e0 = (float)uStack_c60 * 0.070376836;
      fStack_1dc = uStack_c60._4_4_ * 0.070376836;
      local_1f8[0] = -0.1151461;
      local_1f8[1] = -0.1151461;
      afStack_1f0[0] = -0.1151461;
      afStack_1f0[1] = -0.1151461;
      local_d88 = CONCAT44(fStack_1e4 + -0.1151461,local_1e8 + -0.1151461);
      uStack_d80 = CONCAT44(fStack_1dc + -0.1151461,fStack_1e0 + -0.1151461);
      local_260 = &local_d88;
      local_268 = &local_d08;
      local_270 = ::_ps_cephes_log_p2;
      local_228 = local_d88;
      uStack_220 = uStack_d80;
      local_238 = local_d08;
      uStack_230 = uStack_d00;
      local_248 = (local_1e8 + -0.1151461) * (float)local_c68;
      fStack_244 = (fStack_1e4 + -0.1151461) * local_c68._4_4_;
      fStack_240 = (fStack_1e0 + -0.1151461) * (float)uStack_c60;
      fStack_23c = (fStack_1dc + -0.1151461) * uStack_c60._4_4_;
      local_258[0] = 0.116769984;
      local_258[1] = 0.116769984;
      afStack_250[0] = 0.116769984;
      afStack_250[1] = 0.116769984;
      local_d88 = CONCAT44(fStack_244 + 0.116769984,local_248 + 0.116769984);
      uStack_d80 = CONCAT44(fStack_23c + 0.116769984,fStack_240 + 0.116769984);
      local_2c0 = &local_d88;
      local_2c8 = &local_d08;
      local_2d0 = ::_ps_cephes_log_p3;
      local_288 = local_d88;
      uStack_280 = uStack_d80;
      local_298 = local_d08;
      uStack_290 = uStack_d00;
      local_2a8 = (local_248 + 0.116769984) * (float)local_c68;
      fStack_2a4 = (fStack_244 + 0.116769984) * local_c68._4_4_;
      fStack_2a0 = (fStack_240 + 0.116769984) * (float)uStack_c60;
      fStack_29c = (fStack_23c + 0.116769984) * uStack_c60._4_4_;
      local_2b8[0] = -0.12420141;
      local_2b8[1] = -0.12420141;
      afStack_2b0[0] = -0.12420141;
      afStack_2b0[1] = -0.12420141;
      local_d88 = CONCAT44(fStack_2a4 + -0.12420141,local_2a8 + -0.12420141);
      uStack_d80 = CONCAT44(fStack_29c + -0.12420141,fStack_2a0 + -0.12420141);
      local_320 = &local_d88;
      local_328 = &local_d08;
      local_330 = ::_ps_cephes_log_p4;
      local_2e8 = local_d88;
      uStack_2e0 = uStack_d80;
      local_2f8 = local_d08;
      uStack_2f0 = uStack_d00;
      local_308 = (local_2a8 + -0.12420141) * (float)local_c68;
      fStack_304 = (fStack_2a4 + -0.12420141) * local_c68._4_4_;
      fStack_300 = (fStack_2a0 + -0.12420141) * (float)uStack_c60;
      fStack_2fc = (fStack_29c + -0.12420141) * uStack_c60._4_4_;
      local_318[0] = 0.14249323;
      local_318[1] = 0.14249323;
      afStack_310[0] = 0.14249323;
      afStack_310[1] = 0.14249323;
      local_d88 = CONCAT44(fStack_304 + 0.14249323,local_308 + 0.14249323);
      uStack_d80 = CONCAT44(fStack_2fc + 0.14249323,fStack_300 + 0.14249323);
      local_380 = &local_d88;
      local_388 = &local_d08;
      local_390 = ::_ps_cephes_log_p5;
      local_348 = local_d88;
      uStack_340 = uStack_d80;
      local_358 = local_d08;
      uStack_350 = uStack_d00;
      local_368 = (local_308 + 0.14249323) * (float)local_c68;
      fStack_364 = (fStack_304 + 0.14249323) * local_c68._4_4_;
      fStack_360 = (fStack_300 + 0.14249323) * (float)uStack_c60;
      fStack_35c = (fStack_2fc + 0.14249323) * uStack_c60._4_4_;
      local_378[0] = -0.16668057;
      local_378[1] = -0.16668057;
      afStack_370[0] = -0.16668057;
      afStack_370[1] = -0.16668057;
      local_d88 = CONCAT44(fStack_364 + -0.16668057,local_368 + -0.16668057);
      uStack_d80 = CONCAT44(fStack_35c + -0.16668057,fStack_360 + -0.16668057);
      local_3e0 = &local_d88;
      local_3e8 = &local_d08;
      local_3f0 = ::_ps_cephes_log_p6;
      local_3a8 = local_d88;
      uStack_3a0 = uStack_d80;
      local_3b8 = local_d08;
      uStack_3b0 = uStack_d00;
      local_3c8 = (local_368 + -0.16668057) * (float)local_c68;
      fStack_3c4 = (fStack_364 + -0.16668057) * local_c68._4_4_;
      fStack_3c0 = (fStack_360 + -0.16668057) * (float)uStack_c60;
      fStack_3bc = (fStack_35c + -0.16668057) * uStack_c60._4_4_;
      local_3d8[0] = 0.20000714;
      local_3d8[1] = 0.20000714;
      afStack_3d0[0] = 0.20000714;
      afStack_3d0[1] = 0.20000714;
      local_d88 = CONCAT44(fStack_3c4 + 0.20000714,local_3c8 + 0.20000714);
      uStack_d80 = CONCAT44(fStack_3bc + 0.20000714,fStack_3c0 + 0.20000714);
      local_440 = &local_d88;
      local_448 = &local_d08;
      local_450 = ::_ps_cephes_log_p7;
      local_408 = local_d88;
      uStack_400 = uStack_d80;
      local_418 = local_d08;
      uStack_410 = uStack_d00;
      local_428 = (local_3c8 + 0.20000714) * (float)local_c68;
      fStack_424 = (fStack_3c4 + 0.20000714) * local_c68._4_4_;
      fStack_420 = (fStack_3c0 + 0.20000714) * (float)uStack_c60;
      fStack_41c = (fStack_3bc + 0.20000714) * uStack_c60._4_4_;
      local_438[0] = -0.24999994;
      local_438[1] = -0.24999994;
      afStack_430[0] = -0.24999994;
      afStack_430[1] = -0.24999994;
      local_d88 = CONCAT44(fStack_424 + -0.24999994,local_428 + -0.24999994);
      uStack_d80 = CONCAT44(fStack_41c + -0.24999994,fStack_420 + -0.24999994);
      local_4a0 = &local_d88;
      local_4a8 = &local_d08;
      local_4b0 = ::_ps_cephes_log_p8;
      local_468 = local_d88;
      uStack_460 = uStack_d80;
      local_478 = local_d08;
      uStack_470 = uStack_d00;
      local_488 = (local_428 + -0.24999994) * (float)local_c68;
      fStack_484 = (fStack_424 + -0.24999994) * local_c68._4_4_;
      fStack_480 = (fStack_420 + -0.24999994) * (float)uStack_c60;
      fStack_47c = (fStack_41c + -0.24999994) * uStack_c60._4_4_;
      local_498[0] = 0.3333333;
      local_498[1] = 0.3333333;
      afStack_490[0] = 0.3333333;
      afStack_490[1] = 0.3333333;
      local_d88 = CONCAT44(fStack_484 + 0.3333333,local_488 + 0.3333333);
      uStack_d80 = CONCAT44(fStack_47c + 0.3333333,fStack_480 + 0.3333333);
      local_7e8 = local_d88;
      uStack_7e0 = uStack_d80;
      local_7f8 = local_d08;
      uStack_7f0 = uStack_d00;
      fVar8 = (local_488 + 0.3333333) * (float)local_c68;
      fVar13 = (fStack_484 + 0.3333333) * local_c68._4_4_;
      fVar14 = (fStack_480 + 0.3333333) * (float)uStack_c60;
      fVar17 = (fStack_47c + 0.3333333) * uStack_c60._4_4_;
      local_d88 = CONCAT44(fVar13,fVar8);
      uStack_d80 = CONCAT44(fVar17,fVar14);
      local_808 = local_d88;
      uStack_800 = uStack_d80;
      local_818 = CONCAT44(fStack_d74,local_d78);
      uStack_810 = CONCAT44(fStack_d6c,fStack_d70);
      fVar8 = fVar8 * local_d78;
      fVar13 = fVar13 * fStack_d74;
      fVar14 = fVar14 * fStack_d70;
      fVar17 = fVar17 * fStack_d6c;
      local_d88 = CONCAT44(fVar13,fVar8);
      uStack_d80 = CONCAT44(fVar17,fVar14);
      local_500 = &local_d48;
      local_508 = ::_ps_cephes_log_q1;
      local_510 = &local_d88;
      local_4c8 = CONCAT44(fStack_d44,local_d48);
      uStack_4c0 = CONCAT44(fStack_d3c,fStack_d40);
      local_4d8[0] = -0.00021219444;
      local_4d8[1] = -0.00021219444;
      afStack_4d0[0] = -0.00021219444;
      afStack_4d0[1] = -0.00021219444;
      local_4e8 = local_d48 * -0.00021219444;
      fStack_4e4 = fStack_d44 * -0.00021219444;
      fStack_4e0 = fStack_d40 * -0.00021219444;
      fStack_4dc = fStack_d3c * -0.00021219444;
      local_4f8 = local_d88;
      uStack_4f0 = uStack_d80;
      fVar8 = local_4e8 + fVar8;
      fVar13 = fStack_4e4 + fVar13;
      fVar14 = fStack_4e0 + fVar14;
      fVar17 = fStack_4dc + fVar17;
      local_d88 = CONCAT44(fVar13,fVar8);
      uStack_d80 = CONCAT44(fVar17,fVar14);
      local_e0 = &local_d78;
      local_e8 = ::_ps_0p5;
      local_f0 = &local_d88;
      local_c8 = local_d88;
      uStack_c0 = uStack_d80;
      local_a8 = CONCAT44(fStack_d74,local_d78);
      uStack_a0 = CONCAT44(fStack_d6c,fStack_d70);
      local_b8[0] = 0.5;
      local_b8[1] = 0.5;
      afStack_b0[0] = 0.5;
      afStack_b0[1] = 0.5;
      local_d8 = local_d78 * 0.5;
      fStack_d4 = fStack_d74 * 0.5;
      fStack_d0 = fStack_d70 * 0.5;
      fStack_cc = fStack_d6c * 0.5;
      fVar8 = fVar8 - local_d8;
      fVar13 = fVar13 - fStack_d4;
      fVar14 = fVar14 - fStack_d0;
      fVar17 = fVar17 - fStack_cc;
      local_d88 = CONCAT44(fVar13,fVar8);
      uStack_d80 = CONCAT44(fVar17,fVar14);
      local_c78 = local_d08;
      uStack_c70 = uStack_d00;
      local_c88 = local_d88;
      uStack_c80 = uStack_d80;
      local_c68._0_4_ = (float)local_c68 + fVar8;
      local_c68._4_4_ = local_c68._4_4_ + fVar13;
      uStack_c60._0_4_ = (float)uStack_c60 + fVar14;
      uStack_c60._4_4_ = uStack_c60._4_4_ + fVar17;
      local_d08 = CONCAT44(local_c68._4_4_,(float)local_c68);
      uStack_d00._0_4_ = (float)uStack_c60;
      uStack_d00._4_4_ = uStack_c60._4_4_;
      local_560 = &local_d48;
      local_568 = ::_ps_cephes_log_q2;
      local_570 = &local_d08;
      local_528 = CONCAT44(fStack_d44,local_d48);
      uStack_520 = CONCAT44(fStack_d3c,fStack_d40);
      local_538[0] = 0.6933594;
      local_538[1] = 0.6933594;
      afStack_530[0] = 0.6933594;
      afStack_530[1] = 0.6933594;
      local_548 = local_d48 * 0.6933594;
      fStack_544 = fStack_d44 * 0.6933594;
      fStack_540 = fStack_d40 * 0.6933594;
      fStack_53c = fStack_d3c * 0.6933594;
      local_558 = local_d08;
      uStack_550 = uStack_d00;
      local_d08 = CONCAT44(fStack_544 + local_c68._4_4_,local_548 + (float)local_c68);
      uStack_d00._0_4_ = fStack_540 + (float)uStack_c60;
      uStack_d00._4_4_ = fStack_53c + uStack_c60._4_4_;
      local_908 = local_d08;
      uStack_900 = uStack_d00;
      local_918 = CONCAT44(iStack_d34,local_d38);
      uStack_910 = CONCAT44(iStack_d2c,iStack_d30);
      local_d08 = local_d08 | local_918;
      uStack_d00 = uStack_d00 | uStack_910;
      local_dc8 = CONCAT44(-(uint)(0.0 < local_dd8._4_4_),-(uint)(0.0 < (float)local_dd8));
      uStack_dc0 = CONCAT44(-(uint)(0.0 < uStack_dd0._4_4_),-(uint)(0.0 < (float)uStack_dd0));
      local_f68 = (float)(local_db8 & local_dc8);
      local_c18 = local_f68;
      fStack_f64 = (float)((local_db8 & local_dc8) >> 0x20);
      fStack_c14 = fStack_f64;
      fStack_f60 = (float)(uStack_db0 & uStack_dc0);
      fStack_c10 = fStack_f60;
      fStack_f5c = (float)((uStack_db0 & uStack_dc0) >> 0x20);
      fStack_c0c = fStack_f5c;
      local_c28._0_4_ = (float)local_d08;
      local_c28._4_4_ = (float)(local_d08 >> 0x20);
      uStack_c20._0_4_ = (float)uStack_d00;
      uStack_c20._4_4_ = (float)(uStack_d00 >> 0x20);
      local_f28 = CONCAT44(fStack_f64 + local_c28._4_4_,local_f68 + (float)local_c28);
      uStack_f20 = CONCAT44(fStack_f5c + uStack_c20._4_4_,fStack_f60 + (float)uStack_c20);
      local_a40 = local_ea0;
      local_a58 = local_f28;
      uStack_a50 = uStack_f20;
      *(undefined8 *)local_ea0 = local_f28;
      *(undefined8 *)(local_ea0 + 2) = uStack_f20;
      local_ea0 = local_ea0 + 4;
      local_dd8 = local_db8;
      uStack_dd0 = uStack_db0;
      local_d98 = local_db8;
      uStack_d90 = uStack_db0;
      local_c68 = local_d68;
      uStack_c60 = uStack_d60;
      local_c28 = local_d08;
      uStack_c20 = uStack_d00;
      local_bf8 = 0x3f8000003f800000;
      uStack_bf0 = 0x3f8000003f800000;
      local_bb8 = local_d28;
      uStack_bb0 = uStack_d20;
      local_ad8 = local_bc8;
      uStack_ad0 = uStack_bc0;
      local_ab8 = uVar10;
      uStack_ab0 = uVar16;
      local_a88 = local_cb8;
      uStack_a80 = uStack_cb0;
      local_a78 = uVar9;
      uStack_a70 = uVar15;
      local_938 = uVar3;
      uStack_930 = uVar4;
      local_8f8 = local_af8;
      uStack_8f0 = uStack_af0;
      local_888 = local_cb8;
      uStack_880 = uStack_cb0;
      local_878 = local_be8;
      uStack_870 = uStack_be0;
      local_848 = local_858;
      uStack_840 = uStack_850;
      local_828 = uVar1;
      uStack_820 = uVar2;
      local_7c8 = local_7d8;
      uStack_7c0 = uStack_7d0;
      local_748 = local_7b0;
      local_740 = local_7a0;
      local_6e8 = local_7b0;
      local_6e0 = local_7a0;
      local_688 = local_7b0;
      local_680 = local_7a0;
      local_628 = local_7b0;
      local_620 = local_7a0;
      local_5c8 = local_7b0;
      local_5c0 = local_7a0;
      local_1b0 = local_7b0;
      local_150 = local_7b0;
      local_140 = local_1a0;
      local_58 = local_8d8;
      uStack_50 = uStack_8d0;
      local_18 = local_be8;
      uStack_10 = uStack_be0;
    }
    for (; local_ef8 < local_e90; local_ef8 = local_ef8 + 1) {
      if (*local_ea0 <= 0.0) {
        fVar8 = expf(*local_ea0);
        fVar8 = logf(fVar8 + 1.0);
        *local_ea0 = fVar8;
      }
      else {
        fVar8 = *local_ea0;
        fVar13 = expf(-*local_ea0);
        fVar13 = logf(fVar13 + 1.0);
        *local_ea0 = fVar8 + fVar13;
      }
      local_ea0 = local_ea0 + 1;
    }
  }
  return 0;
}

Assistant:

int BNLL_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __mmask16 mask = _mm512_cmp_ps_mask(_p, _zero_avx512, _CMP_GT_OQ);
            __m512 _abs_p = _mm512_castsi512_ps(_mm512_and_epi32(_mm512_castps_si512(_p), _mm512_set1_epi32(0x7fffffff)));
            __m512 _tmp = log512_ps(_mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _abs_p))));
            _p = _mm512_mask_add_ps(_tmp, mask, _tmp, _p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 mask = _mm256_cmp_ps(_p, _mm256_setzero_ps(), _CMP_GT_OQ);
            __m256 _abs_p = _mm256_and_ps(_p, *(__m256*)_ps256_inv_sign_mask);
            __m256 _tmp = log256_ps(_mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _abs_p))));
            __m256 _x = _mm256_and_ps(_p, mask);
            _p = _mm256_add_ps(_x, _tmp);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 mask = _mm_cmpgt_ps(_p, _zero);
            __m128 _abs_p = _mm_and_ps(_p, *(__m128*)_ps_inv_sign_mask);
            __m128 _tmp = log_ps(_mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _abs_p))));
            __m128 _x = _mm_and_ps(_p, mask);
            _p = _mm_add_ps(_x, _tmp);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr > 0)
                *ptr = *ptr + logf(1.f + expf(-(*ptr)));
            else
                *ptr = logf(1.f + expf(*ptr));
            ptr++;
        }
    }
    return 0;
}